

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QThreadPoolThread_*,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QThreadPoolThread*,QHashDummyValue>>::
findNode<QThreadPoolThread*>
          (Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> *this,
          QThreadPoolThread **key)

{
  long lVar1;
  bool bVar2;
  Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> *in_RSI;
  long in_FS_OFFSET;
  Bucket bucket;
  QThreadPoolThread **in_stack_ffffffffffffffc8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QThreadPoolThread*>(in_RSI,in_stack_ffffffffffffffc8);
  bVar2 = Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_>::Bucket::isUnused
                    ((Bucket *)0x6d012b);
  if (bVar2) {
    local_20 = (Node<QThreadPoolThread_*,_QHashDummyValue> *)0x0;
  }
  else {
    local_20 = Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_>::Bucket::node
                         ((Bucket *)0x6d0146);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }